

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O3

void __thiscall KDReports::Test::testTabs(Test *this)

{
  QStringView QVar1;
  QStringView QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined8 extraout_RAX;
  double dVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayDataPointer<QTextOption::Tab> local_e8;
  QList<QTextOption::Tab> tabs2;
  QList<QTextOption::Tab> tabs1;
  double local_98 [2];
  QTextBlock block2;
  Report report;
  QTextBlock block3;
  QFile file;
  QTextBlock block1;
  storage_type_conflict *local_38;
  double local_30;
  
  local_e8.d = (Data *)0x110c05;
  QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&tabs2,(char **)&local_e8);
  QVar7.m_data._4_4_ = tabs2.d.d._4_4_;
  QVar7.m_data._0_4_ = tabs2.d.d._0_4_;
  QVar7.m_size = (qsizetype)&tabs1;
  QString::fromUtf8(QVar7);
  _report = tabs1.d.d;
  tabs1.d.d = (Data *)0x0;
  tabs1.d.ptr = (Tab *)0x0;
  tabs1.d.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tabs1);
  QFile::QFile(&file,(QString *)&report);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&report);
  bVar3 = (bool)QFile::open(&file,1);
  cVar4 = QTest::qVerify(bVar3,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xa5);
  if (cVar4 == '\0') goto LAB_00108e3a;
  KDReports::Report::Report(&report,(QObject *)0x0);
  bVar3 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
  cVar4 = QTest::qVerify(bVar3,"report.loadFromXML(&file)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xa7);
  if (cVar4 != '\0') {
    KDReports::Report::mainTextDocument();
    iVar5 = QTextDocument::blockCount();
    cVar4 = QTest::qCompare(iVar5,3,"doc.blockCount()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0xa9);
    if (cVar4 != '\0') {
      QTextDocument::toPlainText();
      _block2 = "Left\tmiddle\tright\n0\t100\t200\nOnly a right margin";
      QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)&block1,(char **)&block2)
      ;
      QVar8.m_data = _block1;
      QVar8.m_size = (qsizetype)&tabs1;
      QString::fromUtf8(QVar8);
      local_e8.ptr = tabs1.d.ptr;
      local_e8.d = tabs1.d.d;
      tabs1.d.d = (Data *)0x0;
      tabs1.d.ptr = (Tab *)0x0;
      local_e8.size = tabs1.d.size;
      tabs1.d.size = 0;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tabs1);
      QStringView::QStringView<QChar,_true>((QStringView *)&tabs1,(QChar *)tabs2.d.ptr,tabs2.d.size)
      ;
      QStringView::QStringView<QChar,_true>
                ((QStringView *)&block1,(QChar *)local_e8.ptr,local_e8.size);
      QVar1.m_data = (storage_type_conflict *)tabs1.d.ptr;
      QVar1.m_size = (qsizetype)tabs1.d.d;
      QVar2.m_data = local_38;
      QVar2.m_size = (qsizetype)_block1;
      cVar4 = QTest::qCompare(QVar1,QVar2,"doc.toPlainText()",
                              "QString(\"Left\\tmiddle\\tright\\n0\\t100\\t200\\nOnly a right margin\")"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                              ,0xaa);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&tabs2);
      if (cVar4 != '\0') {
        QTextDocument::firstBlock();
        QTextBlock::blockFormat();
        QTextBlockFormat::tabPositions();
        QTextFormat::~QTextFormat((QTextFormat *)&tabs2);
        cVar4 = QTest::qCompare(tabs1.d.size,2,"tabs1.count()","2",
                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                ,0xad);
        if (cVar4 != '\0') {
          if (tabs1.d.size == 0) {
            testTabs();
LAB_00108e5c:
            testTabs();
LAB_00108e61:
            testTabs();
LAB_00108e66:
            testTabs();
            QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs2.d);
            QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs1.d);
            KDReports::Report::~Report(&report);
            QFile::~QFile(&file);
            _Unwind_Resume(extraout_RAX);
          }
          tabs2.d.d._0_4_ = 2;
          bVar3 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                            ((TabType *)(tabs1.d.ptr + 8),(TabType *)&tabs2,"tabs1[0].type",
                             "QTextOption::CenterTab",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0xae);
          if (bVar3) {
            if ((ulong)tabs1.d.size < 2) goto LAB_00108e5c;
            tabs2.d.d._0_4_ = 1;
            bVar3 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                              ((TabType *)(tabs1.d.ptr + 0x18),(TabType *)&tabs2,"tabs1[1].type",
                               "QTextOption::RightTab",
                               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                               ,0xaf);
            if (!bVar3) goto LAB_00108e26;
            QTextBlock::next();
            QTextBlock::blockFormat();
            QTextBlockFormat::tabPositions();
            QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
            cVar4 = QTest::qCompare(tabs2.d.size,2,"tabs2.count()","2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                    ,0xb2);
            if (cVar4 != '\0') {
              if (tabs2.d.size == 0) goto LAB_00108e61;
              local_e8.d = (Data *)((ulong)local_e8.d & 0xffffffff00000000);
              bVar3 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                ((TabType *)(tabs2.d.ptr + 8),(TabType *)&local_e8,"tabs2[0].type",
                                 "QTextOption::LeftTab",
                                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                 ,0xb3);
              if (bVar3) {
                if ((ulong)tabs2.d.size < 2) goto LAB_00108e66;
                local_e8.d = (Data *)((ulong)local_e8.d & 0xffffffff00000000);
                bVar3 = QTest::qCompare<QTextOption::TabType,QTextOption::TabType>
                                  ((TabType *)(tabs2.d.ptr + 0x18),(TabType *)&local_e8,
                                   "tabs2[1].type","QTextOption::LeftTab",
                                   "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                   ,0xb4);
                if (bVar3) {
                  QTextBlock::blockFormat();
                  iVar5 = (int)&local_e8;
                  dVar6 = (double)QTextFormat::doubleProperty(iVar5);
                  cVar4 = QTest::qVerify(100.0 < dVar6,"block2.blockFormat().leftMargin() > 100","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                         ,0xb5);
                  QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
                  if (cVar4 != '\0') {
                    QTextBlock::blockFormat();
                    _block3 = QTextFormat::doubleProperty(iVar5);
                    local_98[0] = 0.0;
                    cVar4 = QTest::qCompare((double *)&block3,local_98,
                                            "block2.blockFormat().rightMargin()","qreal(0)",
                                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                            ,0xb6);
                    QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
                    if (cVar4 != '\0') {
                      QTextBlock::next();
                      QTextBlock::blockFormat();
                      QTextBlockFormat::tabPositions();
                      bVar3 = QTest::
                              _q_compareSequence<QList<QTextOption::Tab>::const_iterator,QList<QTextOption::Tab>::const_iterator>
                                        ((const_iterator)local_e8.ptr,
                                         local_e8.ptr + local_e8.size * 0x10,
                                         (const_iterator)tabs2.d.ptr,
                                         tabs2.d.ptr + tabs2.d.size * 0x10,
                                         "block3.blockFormat().tabPositions()","tabs2",
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                         ,0xb8);
                      QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&local_e8);
                      QTextFormat::~QTextFormat((QTextFormat *)local_98);
                      if (bVar3) {
                        QTextBlock::blockFormat();
                        local_98[0] = (double)QTextFormat::doubleProperty(iVar5);
                        local_30 = 0.0;
                        cVar4 = QTest::qCompare(local_98,&local_30,
                                                "block3.blockFormat().leftMargin()","qreal(0)",
                                                "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                                ,0xb9);
                        QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
                        if (cVar4 != '\0') {
                          QTextBlock::blockFormat();
                          dVar6 = (double)QTextFormat::doubleProperty(iVar5);
                          QTest::qVerify(100.0 < dVar6,"block3.blockFormat().rightMargin() > 100",""
                                         ,
                                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                         ,0xba);
                          QTextFormat::~QTextFormat((QTextFormat *)&local_e8);
                        }
                      }
                    }
                  }
                }
              }
            }
            QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs2.d);
          }
        }
LAB_00108e26:
        QArrayDataPointer<QTextOption::Tab>::~QArrayDataPointer(&tabs1.d);
      }
    }
  }
  KDReports::Report::~Report(&report);
LAB_00108e3a:
  QFile::~QFile(&file);
  return;
}

Assistant:

void testTabs() // and paragraph margins
    {
        QFile file(":/tabs.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        QVERIFY(report.loadFromXML(&file));
        QTextDocument &doc = *report.mainTextDocument();
        QCOMPARE(doc.blockCount(), 3);
        QCOMPARE(doc.toPlainText(), QString("Left\tmiddle\tright\n0\t100\t200\nOnly a right margin"));
        QTextBlock block1 = doc.firstBlock();
        const QList<QTextOption::Tab> tabs1 = block1.blockFormat().tabPositions();
        QCOMPARE(tabs1.count(), 2);
        QCOMPARE(tabs1[0].type, QTextOption::CenterTab);
        QCOMPARE(tabs1[1].type, QTextOption::RightTab);
        QTextBlock block2 = block1.next();
        const QList<QTextOption::Tab> tabs2 = block2.blockFormat().tabPositions();
        QCOMPARE(tabs2.count(), 2);
        QCOMPARE(tabs2[0].type, QTextOption::LeftTab);
        QCOMPARE(tabs2[1].type, QTextOption::LeftTab);
        QVERIFY(block2.blockFormat().leftMargin() > 100);
        QCOMPARE(block2.blockFormat().rightMargin(), qreal(0));
        QTextBlock block3 = block2.next();
        QCOMPARE(block3.blockFormat().tabPositions(), tabs2);
        QCOMPARE(block3.blockFormat().leftMargin(), qreal(0));
        QVERIFY(block3.blockFormat().rightMargin() > 100);
    }